

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *matrix)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  complex<double> *pcVar5;
  int64_t i;
  long lVar6;
  ulong uVar7;
  
  lVar3 = matrix->size_;
  this->size_ = lVar3;
  if (lVar3 != 0) {
    uVar7 = lVar3 * lVar3 * 0x10;
    lVar6 = 0;
    pcVar5 = (complex<double> *)
             operator_new__(-(ulong)((ulong)(lVar3 * lVar3) >> 0x3c != 0) | uVar7);
    memset(pcVar5,0,uVar7);
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = pcVar5;
    pcVar5 = (matrix->data_)._M_t.
             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
    uVar7 = 0;
    do {
      puVar1 = (undefined8 *)(pcVar5->_M_value + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)
               (((this->data_)._M_t.
                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value +
               lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)(this->size_ * this->size_));
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x12,
                "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<double>]");
}

Assistant:

inline int64_t size() const { return size_ ; }